

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

UnicodeString * icu_63::getDateTimeString(UDate time,UnicodeString *str)

{
  int32_t *month_00;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t t;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  UnicodeString *str_local;
  UDate time_local;
  
  month_00 = &dow;
  _month = str;
  str_local = (UnicodeString *)time;
  Grego::timeToFields(time,&dom,month_00,&doy,&mid,&t,&hour);
  UnicodeString::remove(_month,(char *)month_00);
  appendAsciiDigits(dom,'\x04',_month);
  appendAsciiDigits(dow + 1,'\x02',_month);
  appendAsciiDigits(doy,'\x02',_month);
  UnicodeString::append(_month,L'T');
  appendAsciiDigits(hour / 3600000,'\x02',_month);
  appendAsciiDigits((hour % 3600000) / 60000,'\x02',_month);
  appendAsciiDigits(((hour % 3600000) % 60000) / 1000,'\x02',_month);
  return _month;
}

Assistant:

static UnicodeString& getDateTimeString(UDate time, UnicodeString& str) {
    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(time, year, month, dom, dow, doy, mid);

    str.remove();
    appendAsciiDigits(year, 4, str);
    appendAsciiDigits(month + 1, 2, str);
    appendAsciiDigits(dom, 2, str);
    str.append((UChar)0x0054 /*'T'*/);

    int32_t t = mid;
    int32_t hour = t / U_MILLIS_PER_HOUR;
    t %= U_MILLIS_PER_HOUR;
    int32_t min = t / U_MILLIS_PER_MINUTE;
    t %= U_MILLIS_PER_MINUTE;
    int32_t sec = t / U_MILLIS_PER_SECOND;

    appendAsciiDigits(hour, 2, str);
    appendAsciiDigits(min, 2, str);
    appendAsciiDigits(sec, 2, str);
    return str;
}